

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlSetObjectNumberU64(JlDataObject *NumberObject,uint64_t NumberU64)

{
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  uint64_t NumberU64_local;
  JlDataObject *NumberObject_local;
  
  if (NumberObject == (JlDataObject *)0x0) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    (NumberObject->field_2).Number.Type = JL_NUM_TYPE_UNSIGNED;
    (NumberObject->field_2).Number.IsHex = false;
    (NumberObject->field_2).Number.field_1.u64 = NumberU64;
    local_1c = JL_STATUS_SUCCESS;
  }
  else {
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlSetObjectNumberU64
    (
        JlDataObject*   NumberObject,
        uint64_t        NumberU64
    )
{
    JL_STATUS jlStatus;

    if( NULL != NumberObject )
    {
        if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            NumberObject->Number.Type = JL_NUM_TYPE_UNSIGNED;
            NumberObject->Number.IsHex = false;
            NumberObject->Number.u64 = NumberU64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}